

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  size_t *psVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  huff_entropy_ptr entropy;
  jpeg_destination_mgr *pjVar5;
  jpeg_component_info *pjVar6;
  jpeg_error_mgr *pjVar7;
  j_compress_ptr pjVar8;
  JOCTET *pJVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  
  entropy = (huff_entropy_ptr)cinfo->entropy;
  iVar3 = cinfo->Al;
  pjVar5 = cinfo->dest;
  entropy->next_output_byte = pjVar5->next_output_byte;
  entropy->free_in_buffer = pjVar5->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar18 = 0;
    do {
      iVar11 = (int)(*MCU_data[lVar18])[0] >> ((byte)iVar3 & 0x1f);
      iVar14 = cinfo->MCU_membership[lVar18];
      iVar15 = (entropy->saved).last_dc_val[iVar14];
      pjVar6 = cinfo->cur_comp_info[iVar14];
      (entropy->saved).last_dc_val[iVar14] = iVar11;
      uVar13 = 0;
      uVar12 = iVar11 - iVar15;
      if (uVar12 != 0) {
        uVar4 = -uVar12;
        if (0 < (int)uVar12) {
          uVar4 = uVar12;
        }
        uVar13 = 0;
        uVar17 = (ulong)uVar4;
        do {
          uVar13 = uVar13 + 1;
          uVar17 = uVar17 >> 1;
          bVar10 = 1 < uVar4;
          uVar4 = (uint)uVar17;
        } while (bVar10);
      }
      if (0xb < uVar13) {
        pjVar7 = cinfo->err;
        pjVar7->msg_code = 6;
        (*pjVar7->error_exit)((j_common_ptr)cinfo);
      }
      iVar14 = pjVar6->dc_tbl_no;
      if (entropy->gather_statistics == 0) {
        uVar4 = entropy->dc_derived_tbls[iVar14]->ehufco[uVar13];
        bVar2 = entropy->dc_derived_tbls[iVar14]->ehufsi[uVar13];
        iVar14 = (entropy->saved).put_bits;
        if (bVar2 == 0) {
          pjVar8 = entropy->cinfo;
          pjVar7 = pjVar8->err;
          pjVar7->msg_code = 0x29;
          (*pjVar7->error_exit)((j_common_ptr)pjVar8);
        }
        if (entropy->gather_statistics == 0) {
          iVar14 = iVar14 + (char)bVar2;
          uVar17 = (ulong)(uVar4 & ~(uint)(-1L << (bVar2 & 0x3f))) << (0x18U - (char)iVar14 & 0x3f)
                   | (entropy->saved).put_buffer;
          iVar16 = iVar14;
          if (7 < iVar14) {
            do {
              pJVar9 = entropy->next_output_byte;
              entropy->next_output_byte = pJVar9 + 1;
              *pJVar9 = (JOCTET)(uVar17 >> 0x10);
              psVar1 = &entropy->free_in_buffer;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) {
                dump_buffer_e(entropy);
              }
              if ((~(uint)uVar17 & 0xff0000) == 0) {
                pJVar9 = entropy->next_output_byte;
                entropy->next_output_byte = pJVar9 + 1;
                *pJVar9 = '\0';
                psVar1 = &entropy->free_in_buffer;
                *psVar1 = *psVar1 - 1;
                if (*psVar1 == 0) {
                  dump_buffer_e(entropy);
                }
              }
              uVar17 = uVar17 << 8;
              iVar14 = iVar16 + -8;
              bVar10 = 0xf < iVar16;
              iVar16 = iVar14;
            } while (bVar10);
          }
          (entropy->saved).put_buffer = uVar17;
          (entropy->saved).put_bits = iVar14;
        }
      }
      else {
        entropy->dc_count_ptrs[iVar14][uVar13] = entropy->dc_count_ptrs[iVar14][uVar13] + 1;
      }
      if ((uVar13 != 0) && (entropy->gather_statistics == 0)) {
        iVar14 = uVar13 + (entropy->saved).put_bits;
        uVar17 = (ulong)(~(uint)(-1L << ((byte)uVar13 & 0x3f)) & (iVar11 - iVar15 >> 0x1f) + uVar12)
                 << (0x18U - (char)iVar14 & 0x3f) | (entropy->saved).put_buffer;
        iVar15 = iVar14;
        if (7 < iVar14) {
          do {
            pJVar9 = entropy->next_output_byte;
            entropy->next_output_byte = pJVar9 + 1;
            *pJVar9 = (JOCTET)(uVar17 >> 0x10);
            psVar1 = &entropy->free_in_buffer;
            *psVar1 = *psVar1 - 1;
            if (*psVar1 == 0) {
              dump_buffer_e(entropy);
            }
            if ((~(uint)uVar17 & 0xff0000) == 0) {
              pJVar9 = entropy->next_output_byte;
              entropy->next_output_byte = pJVar9 + 1;
              *pJVar9 = '\0';
              psVar1 = &entropy->free_in_buffer;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) {
                dump_buffer_e(entropy);
              }
            }
            uVar17 = uVar17 << 8;
            iVar14 = iVar15 + -8;
            bVar10 = 0xf < iVar15;
            iVar15 = iVar14;
          } while (bVar10);
        }
        (entropy->saved).put_buffer = uVar17;
        (entropy->saved).put_bits = iVar14;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < cinfo->blocks_in_MCU);
  }
  pjVar5 = cinfo->dest;
  pjVar5->next_output_byte = entropy->next_output_byte;
  pjVar5->free_in_buffer = entropy->free_in_buffer;
  if (cinfo->restart_interval != 0) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
    }
    entropy->restarts_to_go = entropy->restarts_to_go - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp, temp2;
  register int nbits;
  int blkn, ci;
  int Al = cinfo->Al;
  JBLOCKROW block;
  jpeg_component_info * compptr;
  ISHIFT_TEMPS

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    temp2 = IRIGHT_SHIFT((int) ((*block)[0]), Al);

    /* DC differences are figured on the point-transformed values. */
    temp = temp2 - entropy->saved.last_dc_val[ci];
    entropy->saved.last_dc_val[ci] = temp2;

    /* Encode the DC coefficient difference per section G.1.2.1 */
    temp2 = temp;
    if (temp < 0) {
      temp = -temp;		/* temp is abs value of input */
      /* For a negative input, want temp2 = bitwise complement of abs(input) */
      /* This code assumes we are on a two's complement machine */
      temp2--;
    }
    
    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = 0;
    while (temp) {
      nbits++;
      temp >>= 1;
    }
    /* Check for out-of-range coefficient values.
     * Since we're encoding a difference, the range limit is twice as much.
     */
    if (nbits > MAX_COEF_BITS+1)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);
    
    /* Count/emit the Huffman-coded symbol for the number of bits */
    emit_dc_symbol(entropy, compptr->dc_tbl_no, nbits);
    
    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    if (nbits)			/* emit_bits rejects calls with size 0 */
      emit_bits_e(entropy, (unsigned int) temp2, nbits);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}